

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

errr cmdq_push_repeat(cmd_code c,wchar_t nrepeats)

{
  cmd_code cVar1;
  errr eVar2;
  long lVar3;
  bool bVar4;
  command_conflict cmd;
  command_conflict cStack_c8;
  
  memset(&cStack_c8,0,0xb0);
  lVar3 = 0;
  do {
    cVar1 = *(cmd_code *)((long)&game_cmds[0].cmd + lVar3);
    if (cVar1 == c) break;
    bVar4 = lVar3 != 0xe00;
    lVar3 = lVar3 + 0x20;
  } while (bVar4);
  eVar2 = 1;
  if (cVar1 == c) {
    cStack_c8.code = c;
    cStack_c8.nrepeats = nrepeats;
    eVar2 = cmdq_push_copy(&cStack_c8);
  }
  return eVar2;
}

Assistant:

errr cmdq_push_repeat(cmd_code c, int nrepeats)
{
	struct command cmd = {
		.context = CTX_INIT,
		.code = CMD_NULL,
		.nrepeats = 0,
		.background_command = 0,
		.arg = { { 0 } }
	};

	if (cmd_idx(c) == -1)
		return 1;

	cmd.code = c;
	cmd.nrepeats = nrepeats;

	return cmdq_push_copy(&cmd);
}